

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void lyp_del_includedup(lys_module *mod,int free_subs)

{
  byte bVar1;
  ly_ctx *plVar2;
  lys_module *plVar3;
  byte bVar4;
  ulong uVar5;
  
  if ((mod->field_0x40 & 1) == 0) {
    plVar2 = mod->ctx;
    bVar1 = (plVar2->models).parsed_submodules_count;
    if (bVar1 != 0) {
      bVar4 = bVar1;
      do {
        bVar4 = bVar4 - 1;
        plVar3 = (plVar2->models).parsed_submodules[bVar4];
      } while ((plVar3->field_0x40 & 1) != 0);
      if (plVar3 == mod) {
        if (free_subs != 0) {
          bVar4 = bVar1 - 1;
          uVar5 = (ulong)bVar4;
          plVar3 = (plVar2->models).parsed_submodules[uVar5];
          bVar1 = plVar3->field_0x40;
          while ((bVar1 & 1) != 0) {
            lys_sub_module_remove_devs_augs(plVar3);
            lys_submodule_module_data_free
                      ((lys_submodule *)(plVar2->models).parsed_submodules[uVar5]);
            lys_submodule_free((lys_submodule *)(plVar2->models).parsed_submodules[uVar5],
                               (_func_void_lys_node_ptr_void_ptr *)0x0);
            bVar4 = bVar4 - 1;
            uVar5 = (ulong)bVar4;
            plVar3 = (plVar2->models).parsed_submodules[uVar5];
            bVar1 = plVar3->field_0x40;
          }
        }
        (plVar2->models).parsed_submodules_count = bVar4;
        if (bVar4 == 0) {
          free((plVar2->models).parsed_submodules);
          (plVar2->models).parsed_submodules = (lys_module **)0x0;
        }
      }
    }
    return;
  }
  __assert_fail("mod && !mod->type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                ,0xa35,"void lyp_del_includedup(struct lys_module *, int)");
}

Assistant:

void
lyp_del_includedup(struct lys_module *mod, int free_subs)
{
    struct ly_modules_list *models = &mod->ctx->models;
    uint8_t i;

    assert(mod && !mod->type);

    if (models->parsed_submodules_count) {
        for (i = models->parsed_submodules_count - 1; models->parsed_submodules[i]->type; --i);
        if (models->parsed_submodules[i] == mod) {
            if (free_subs) {
                for (i = models->parsed_submodules_count - 1; models->parsed_submodules[i]->type; --i) {
                    lys_sub_module_remove_devs_augs((struct lys_module *)models->parsed_submodules[i]);
                    lys_submodule_module_data_free((struct lys_submodule *)models->parsed_submodules[i]);
                    lys_submodule_free((struct lys_submodule *)models->parsed_submodules[i], NULL);
                }
            }

            models->parsed_submodules_count = i;
            if (!models->parsed_submodules_count) {
                free(models->parsed_submodules);
                models->parsed_submodules = NULL;
            }
        }
    }
}